

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnitureStandard::~IfcFurnitureStandard(IfcFurnitureStandard *this)

{
  IfcObject::~IfcObject((IfcObject *)this,&PTR_construction_vtable_24__00782e30);
  return;
}

Assistant:

IfcFurnitureStandard() : Object("IfcFurnitureStandard") {}